

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::RobustnessTestCase::Params::Params
          (Params *this,string *name,string *description,RobustAccessType *robustAccessType,
          ContextResetType *contextResetType,FixedFunctionType *fixedFunctionType)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)description);
  this->m_robustAccessType = *robustAccessType;
  this->m_contextResetType = *contextResetType;
  this->m_fixedFunctionType = *fixedFunctionType;
  return;
}

Assistant:

RobustnessTestCase::Params::Params (const string&				name,
									const string&				description,
									const RobustAccessType&		robustAccessType,
									const ContextResetType&		contextResetType,
									const FixedFunctionType&	fixedFunctionType)
	: m_name				(name)
	, m_description			(description)
	, m_robustAccessType	(robustAccessType)
	, m_contextResetType	(contextResetType)
	, m_fixedFunctionType	(fixedFunctionType)
{
}